

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

Filter * helics::generateFilter
                   (Federate *fed,bool global,bool cloning,string_view name,FilterTypes operation,
                   string_view inputType,string_view outputType)

{
  Filter *pFVar1;
  int in_R9D;
  undefined8 in_stack_00000008;
  Filter *in_stack_00000010;
  Filter *filt;
  bool in_stack_00000176;
  bool in_stack_00000177;
  Federate *in_stack_00000178;
  undefined1 in_stack_00000180 [16];
  undefined1 in_stack_000001a0 [16];
  undefined1 in_stack_000001b0 [16];
  
  pFVar1 = registerFilter(in_stack_00000178,in_stack_00000177,in_stack_00000176,
                          (string_view)in_stack_00000180,(string_view)in_stack_000001a0,
                          (string_view)in_stack_000001b0);
  if (in_R9D != 0) {
    Filter::setFilterType(in_stack_00000010,in_stack_00000008._4_4_);
  }
  return pFVar1;
}

Assistant:

static Filter& generateFilter(Federate* fed,
                              bool global,
                              bool cloning,
                              std::string_view name,
                              FilterTypes operation,
                              std::string_view inputType,
                              std::string_view outputType)
{
    auto& filt = registerFilter(fed, global, cloning, name, inputType, outputType);
    if (operation != FilterTypes::CUSTOM) {
        filt.setFilterType(static_cast<std::int32_t>(operation));
    }
    return filt;
}